

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O1

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  If_Cut_t *pCut;
  float *pfVar1;
  int (*paiVar2) [32];
  float fVar3;
  char cVar4;
  short sVar5;
  If_Par_t *pIVar6;
  If_Obj_t *pIVar7;
  If_Cut_t *pC;
  Vec_Mem_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  code *pcVar10;
  _func_int_If_Man_t_ptr_If_Cut_t_ptr *p_Var11;
  Vec_Str_t *pVVar12;
  If_Man_t *pIVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  If_Man_t *pCutSet;
  int *piVar18;
  char *pcVar19;
  If_Set_t *pIVar20;
  word *pwVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  int iVar25;
  undefined1 *puVar26;
  If_Man_t **ppIVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  word *pwVar31;
  long lVar32;
  long lVar33;
  If_Cut_t *pIVar34;
  size_t __size;
  If_Man_t **ppIVar35;
  undefined1 *puVar36;
  uint uVar37;
  uint uVar38;
  If_Cut_t *pIVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  If_Man_t *pIVar45;
  If_Man_t *pIVar46;
  If_Cut_t *pIVar47;
  void *__s;
  uint uVar48;
  ulong *puVar49;
  ulong *puVar50;
  ulong uVar51;
  If_Cut_t *pCut1;
  int iVar52;
  If_Cut_t *pCut0;
  float fVar53;
  word *pLimit;
  word *tLimit_1;
  word *tLimit;
  int Cost;
  long local_8c8;
  uint local_898;
  undefined1 local_838 [1024];
  If_Man_t *local_438 [129];
  
  pIVar6 = p->pPars;
  local_898 = 1;
  if (((((((pIVar6->fDelayOpt == 0) && (pIVar6->fDelayOptLut == 0)) && (pIVar6->fDsdBalance == 0))
        && ((pIVar6->fUserRecLib == 0 && (pIVar6->fUserSesLib == 0)))) &&
       ((pIVar6->fUseDsdTune == 0 && ((pIVar6->fUseCofVars == 0 && (pIVar6->fUseAndVars == 0))))))
      && (pIVar6->fUse34Spec == 0)) && (pIVar6->pLutStruct == (char *)0x0)) {
    local_898 = (uint)(pIVar6->pFuncCell2 !=
                      (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0);
  }
  bVar14 = true;
  if (pIVar6->nAndDelay < 1) {
    bVar14 = 0 < pIVar6->nAndArea;
  }
  if ((((undefined1  [112])*pObj->pFanin0 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin0->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xac,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((((undefined1  [112])*pObj->pFanin1 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin1->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xad,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if (Mode == 1) {
    fVar53 = (pObj->EstRefs + pObj->EstRefs + (float)pObj->nRefs) / 3.0;
LAB_0042dfca:
    pObj->EstRefs = fVar53;
  }
  else if (Mode == 0) {
    fVar53 = (float)pObj->nRefs;
    goto LAB_0042dfca;
  }
  if ((Mode != 0) && (0 < pObj->nRefs)) {
    If_CutAreaDeref(p,&pObj->CutBest);
  }
  pIVar45 = p;
  pCutSet = (If_Man_t *)If_ManSetupNodeCutSet(p,pObj);
  pCut = &pObj->CutBest;
  if (fFirst != 0) goto LAB_0042e16c;
  pIVar6 = p->pPars;
  if (pIVar6->fDelayOpt == 0) {
    if (pIVar6->fDsdBalance != 0) {
      pIVar45 = p;
      iVar15 = If_CutDsdBalanceEval(p,pCut,(Vec_Int_t *)0x0);
      iVar16 = (int)pIVar45;
      goto LAB_0042e05e;
    }
    if (pIVar6->fUserRecLib != 0) {
      pIVar45 = p;
      iVar15 = If_CutDelayRecCost3(p,pCut,pObj);
      iVar16 = (int)pIVar45;
      goto LAB_0042e05e;
    }
    if (pIVar6->fUserSesLib == 0) {
      if (pIVar6->fDelayOptLut != 0) {
        pIVar45 = p;
        iVar15 = If_CutLutBalanceEval(p,pCut);
        iVar16 = (int)pIVar45;
        goto LAB_0042e05e;
      }
      if (0 < pIVar6->nGateSize) {
        pIVar45 = p;
        iVar15 = If_CutDelaySop(p,pCut);
        iVar16 = (int)pIVar45;
        goto LAB_0042e05e;
      }
      pIVar45 = p;
      fVar53 = If_CutDelay(p,pObj,pCut);
      iVar16 = (int)pIVar45;
      goto LAB_0042e06a;
    }
    local_838._0_8_ = local_838._0_8_ & 0xffffffff00000000;
    puVar36 = &(pObj->CutBest).field_0x1d;
    *puVar36 = *puVar36 | 0x20;
    pwVar21 = If_CutTruthW(p,pCut);
    bVar23 = (pObj->CutBest).field_0x1f;
    piVar18 = If_CutArrTimeProfile(p,pCut);
    bVar22 = (pObj->CutBest).field_0x1f;
    iVar15 = If_ManCutAigDelay(p,pObj,pCut);
    iVar15 = Abc_ExactDelayCost(pwVar21,(uint)bVar23,piVar18,&pObj[1].field_0x0 + (ulong)bVar22 * 4,
                                (int *)local_838,iVar15);
    iVar16 = (int)pwVar21;
    (pObj->CutBest).Delay = (float)iVar15;
    if ((float)local_838._0_4_ == 0.0047237873) {
      uVar24 = *(uint *)&(pObj->CutBest).field_0x1c;
      if (0xffffff < uVar24) {
        __s = &pObj[1].field_0x0 + (ulong)(uVar24 >> 0x18) * 4;
        memset(__s,0x78,(ulong)((uVar24 >> 0x18) - 1) + 1);
        iVar16 = (int)__s;
      }
      *(uint *)&(pObj->CutBest).field_0x1c = uVar24 | 0x4fff;
    }
  }
  else {
    pIVar45 = p;
    iVar15 = If_CutSopBalanceEval(p,pCut,(Vec_Int_t *)0x0);
    iVar16 = (int)pIVar45;
LAB_0042e05e:
    fVar53 = (float)iVar15;
LAB_0042e06a:
    (pObj->CutBest).Delay = fVar53;
  }
  fVar53 = (pObj->CutBest).Delay;
  if ((fVar53 == -1.0) && (!NAN(fVar53))) {
    __assert_fail("pCut->Delay != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xd9,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  fVar3 = p->fEpsilon;
  if (fVar3 + fVar3 + pObj->Required < fVar53) {
    Abc_Print(iVar16,
              "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n"
              ,(double)fVar53,(double)(pObj->Required + fVar3),(ulong)(uint)pObj->Id);
  }
  if (Mode == 2) {
    pIVar45 = p;
    fVar53 = If_CutAreaDerefed(p,pCut);
  }
  else {
    pIVar45 = p;
    fVar53 = If_CutAreaFlow(p,pCut);
  }
  pCut->Area = fVar53;
  if (p->pPars->fEdge != 0) {
    if (Mode == 2) {
      pIVar45 = p;
      fVar53 = If_CutEdgeDerefed(p,pCut);
    }
    else {
      pIVar45 = p;
      fVar53 = If_CutEdgeFlow(p,pCut);
    }
    (pObj->CutBest).Edge = fVar53;
  }
  if (p->pPars->fPower != 0) {
    if (Mode == 2) {
      pIVar45 = p;
      fVar53 = If_CutPowerDerefed(p,pCut,pObj);
    }
    else {
      pIVar45 = p;
      fVar53 = If_CutPowerFlow(p,pCut,pObj);
    }
    (pObj->CutBest).Power = fVar53;
  }
  if (fPreprocess == 0) {
    pIVar7 = pCutSet->pConst1;
    sVar5 = *(short *)((long)&pCutSet->pName + 2);
    *(short *)((long)&pCutSet->pName + 2) = sVar5 + 1;
    pIVar45 = *(If_Man_t **)(&pIVar7->field_0x0 + (long)sVar5 * 8);
    memcpy(pIVar45,pCut,(long)p->nCutBytes);
  }
LAB_0042e16c:
  iVar15 = (int)pIVar45;
  pIVar20 = pObj->pFanin0->pCutSet;
  if (0 < pIVar20->nCuts) {
    lVar33 = 0;
    do {
      iVar15 = (int)pIVar45;
      pIVar47 = pIVar20->ppCuts[lVar33];
      if (pIVar47 == (If_Cut_t *)0x0) break;
      pIVar20 = pObj->pFanin1->pCutSet;
      if (0 < pIVar20->nCuts) {
        lVar32 = 0;
        do {
          pIVar34 = pIVar20->ppCuts[lVar32];
          if (pIVar34 == (If_Cut_t *)0x0) break;
          sVar5 = *(short *)((long)&pCutSet->pName + 2);
          if (*(short *)&pCutSet->pName < sVar5) {
            __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                          ,0xed,
                          "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
          }
          uVar24 = pIVar34->uSign | pIVar47->uSign;
          uVar24 = (uVar24 >> 1 & 0x55555555) + (uVar24 & 0x55555555);
          uVar24 = (uVar24 >> 2 & 0x33333333) + (uVar24 & 0x33333333);
          uVar24 = (uVar24 >> 4 & 0x7070707) + (uVar24 & 0x7070707);
          uVar24 = (uVar24 >> 8 & 0xf000f) + (uVar24 & 0xf000f);
          pIVar45 = (If_Man_t *)p->pPars;
          if ((int)((uVar24 >> 0x10) + (uVar24 & 0xffff)) <= *(int *)&pIVar45->pName) {
            uVar29 = *(uint *)pObj >> 4 & 1 ^
                     *(uint *)&pIVar47->field_0x1c >> 0xc & 1 ^ pIVar47->iCutFunc;
            uVar24 = *(uint *)pObj >> 5 & 1 ^ pIVar34->iCutFunc ^
                     *(uint *)&pIVar34->field_0x1c >> 0xc & 1;
            iVar15 = *(int *)((long)&pIVar45->puTempW + 4);
            pCut1 = pIVar34;
            pCut0 = pIVar47;
            uVar38 = uVar29;
            if (((iVar15 != 0) &&
                (uVar37 = *(uint *)&pIVar47->field_0x1c >> 0x18,
                uVar48 = *(uint *)&pIVar34->field_0x1c >> 0x18, uVar37 <= uVar48)) &&
               ((uVar37 != uVar48 || ((int)uVar29 <= (int)uVar24)))) {
              pCut1 = pIVar47;
              pCut0 = pIVar34;
              uVar38 = uVar24;
              uVar24 = uVar29;
            }
            pC = *(If_Cut_t **)(&pCutSet->pConst1->field_0x0 + (long)sVar5 * 8);
            if (iVar15 == 0) {
              pIVar45 = p;
              iVar15 = If_CutMergeOrdered(p,pIVar47,pIVar34,pC);
            }
            else {
              pIVar45 = p;
              iVar15 = If_CutMerge(p,pCut0,pCut1,pC);
            }
            if ((iVar15 != 0) &&
               (((pObj->field_0x1 & 4) == 0 || ((uint)(byte)pC->field_0x1f != p->pPars->nLutSize))))
            {
              p->nCutsMerged = p->nCutsMerged + 1;
              p->nCutsTotal = p->nCutsTotal + 1;
              if ((p->pPars->fSkipCutFilter != 0) ||
                 (pIVar45 = pCutSet, iVar15 = If_CutFilter((If_Set_t *)pCutSet,pC,local_898),
                 iVar15 == 0)) {
                uVar29 = 0;
                if (((bVar14) && (uVar29 = 0, pC->field_0x1f == '\x02')) &&
                   (pC[1].Area == (float)pObj->pFanin0->Id)) {
                  uVar29 = (uint)(pC[1].Edge == (float)pObj->pFanin1->Id) << 0xf;
                }
                pC->iCutFunc = -1;
                *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffff6fff | uVar29;
                if (p->pPars->fTruth != 0) {
                  if (p->pPars->fVerbose == 0) {
                    local_8c8 = 0;
                  }
                  else {
                    iVar15 = clock_gettime(3,(timespec *)local_838);
                    if (iVar15 < 0) {
                      local_8c8 = 1;
                    }
                    else {
                      lVar30 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_838._8_8_),
                                      8);
                      local_8c8 = ((lVar30 >> 7) - (lVar30 >> 0x3f)) + local_838._0_8_ * -1000000;
                    }
                  }
                  pIVar39 = pC;
                  if (p->pPars->fUseTtPerm == 0) {
                    iVar15 = If_CutComputeTruth(p,pC,pIVar47,pIVar34,*(uint *)pObj >> 4 & 1,
                                                *(uint *)pObj >> 5 & 1);
                  }
                  else {
                    iVar15 = If_CutComputeTruthPerm(p,pC,pCut0,pCut1,uVar38,uVar24);
                  }
                  if (p->pPars->fVerbose != 0) {
                    pIVar39 = (If_Cut_t *)local_838;
                    iVar16 = clock_gettime(3,(timespec *)pIVar39);
                    if (iVar16 < 0) {
                      lVar30 = -1;
                    }
                    else {
                      lVar30 = (long)local_838._8_8_ / 1000 + local_838._0_8_ * 1000000;
                    }
                    p->timeCache[4] = p->timeCache[4] + lVar30 + local_8c8;
                  }
                  if ((p->pPars->fSkipCutFilter == 0) && (iVar15 != 0)) {
                    pIVar39 = pC;
                    pIVar45 = pCutSet;
                    iVar15 = If_CutFilter((If_Set_t *)pCutSet,pC,local_898);
                    iVar16 = 10;
                    if (iVar15 == 0) goto LAB_0042e52a;
                  }
                  else {
LAB_0042e52a:
                    if (((p->pPars->fLut6Filter == 0) || (pC->field_0x1f != '\x06')) ||
                       (pIVar39 = pC, pIVar45 = p, iVar15 = If_CutCheckTruth6(p,pC), iVar15 != 0)) {
                      if (p->pPars->fUseDsd != 0) {
                        if (pC->iCutFunc < 0) goto LAB_0042fdc1;
                        uVar24 = (uint)pC->iCutFunc >> 1;
                        if ((p->vTtDsds[(byte)pC->field_0x1f]->nSize <= (int)uVar24) ||
                           (p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar24] == -1)) {
                          while( true ) {
                            bVar23 = pC->field_0x1f;
                            if ((int)uVar24 < p->vTtDsds[bVar23]->nSize) break;
                            Vec_IntPush(p->vTtDsds[bVar23],(int)pIVar39);
                            uVar38 = (uint)(byte)pC->field_0x1f;
                            uVar29 = 0;
                            do {
                              pVVar12 = p->vTtPerms[uVar38];
                              uVar38 = pVVar12->nCap;
                              if (pVVar12->nSize == uVar38) {
                                if ((int)uVar38 < 0x10) {
                                  if (pVVar12->pArray == (char *)0x0) {
                                    pcVar19 = (char *)malloc(0x10);
                                  }
                                  else {
                                    pIVar39 = (If_Cut_t *)&DAT_00000010;
                                    pcVar19 = (char *)realloc(pVVar12->pArray,0x10);
                                  }
                                  pVVar12->pArray = pcVar19;
                                  pIVar34 = (If_Cut_t *)&DAT_00000010;
                                }
                                else {
                                  pIVar34 = (If_Cut_t *)((ulong)uVar38 * 2);
                                  if ((int)pIVar34 <= (int)uVar38) goto LAB_0042e625;
                                  if (pVVar12->pArray == (char *)0x0) {
                                    pcVar19 = (char *)malloc((size_t)pIVar34);
                                  }
                                  else {
                                    pIVar39 = pIVar34;
                                    pcVar19 = (char *)realloc(pVVar12->pArray,(size_t)pIVar34);
                                  }
                                  pVVar12->pArray = pcVar19;
                                }
                                pVVar12->nCap = (int)pIVar34;
                              }
LAB_0042e625:
                              iVar15 = pVVar12->nSize;
                              pVVar12->nSize = iVar15 + 1;
                              pVVar12->pArray[iVar15] = 'x';
                              uVar29 = uVar29 + 1;
                              uVar38 = *(uint *)&pC->field_0x1c >> 0x18;
                              uVar37 = 6;
                              if (6 < uVar38) {
                                uVar37 = uVar38;
                              }
                            } while (uVar29 < uVar37);
                          }
                          pVVar8 = p->vTtMem[bVar23];
                          if (pVVar8 == (Vec_Mem_t *)0x0) {
                            pwVar21 = (word *)0x0;
                          }
                          else {
                            if (pC->iCutFunc < 0) goto LAB_0042fdc1;
                            uVar38 = (uint)pC->iCutFunc >> 1;
                            if (pVVar8->nEntries <= (int)uVar38) goto LAB_0042fe7b;
                            pwVar21 = pVVar8->ppPages[uVar38 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                                      (ulong)(uVar38 & pVVar8->PageMask) * (long)pVVar8->nEntrySize;
                          }
                          if (pC->iCutFunc < 0) goto LAB_0042fdc1;
                          uVar38 = 6;
                          if (6 < bVar23) {
                            uVar38 = (uint)bVar23;
                          }
                          uVar38 = uVar38 * ((uint)pC->iCutFunc >> 1);
                          if (p->vTtPerms[bVar23]->nSize <= (int)uVar38) {
                            __assert_fail("i >= 0 && i < p->nSize",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                          ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
                          }
                          iVar15 = If_DsdManCompute(p->pIfDsdMan,pwVar21,(uint)bVar23,
                                                    (uchar *)(p->vTtPerms[bVar23]->pArray + uVar38),
                                                    p->pPars->pLutStruct);
                          if (p->vTtDsds[(byte)pC->field_0x1f]->nSize <= (int)uVar24)
                          goto LAB_0042feb9;
                          p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar24] = iVar15;
                        }
                        uVar24 = pC->iCutFunc;
                        if ((int)uVar24 < 0) goto LAB_0042fdff;
                        uVar38 = p->vTtDsds[(byte)pC->field_0x1f]->pArray[uVar24 >> 1];
                        if ((int)uVar38 < 0) goto LAB_0042fde0;
                        uVar38 = uVar38 ^ uVar24 & 1;
                        pIVar39 = (If_Cut_t *)(ulong)uVar38;
                        uVar24 = If_DsdManSuppSize(p->pIfDsdMan,uVar38);
                        if (uVar24 != (byte)pC->field_0x1f) {
                          __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                        ,0x138,
                                        "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                       );
                        }
                      }
                      uVar24 = *(uint *)&pC->field_0x1c;
                      *(uint *)&pC->field_0x1c = uVar24 & 0xffffbfff;
                      pIVar45 = (If_Man_t *)p->pPars;
                      pVVar9 = *(Vec_Ptr_t **)(pIVar45->pPerm[0] + 0x1e);
                      if ((pVVar9 == (Vec_Ptr_t *)0x0) && (*(long *)pIVar45->pPerm[1] == 0)) {
                        if (*(int *)(pIVar45->puTemp + 3) == 0) {
                          if (pIVar45->dPower == 0.0) {
                            if (*(int *)&pIVar45->puTempW != 0) {
                              if (pC->iCutFunc < 0) goto LAB_0042fdc1;
                              if (0xd < *(int *)&pIVar45->pName) {
                                __assert_fail("p->pPars->nLutSize <= 13",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                              ,0x176,
                                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                             );
                              }
                              uVar38 = (uint)pC->iCutFunc >> 1;
                              if ((p->vTtDecs[uVar24 >> 0x18]->nSize <= (int)uVar38) ||
                                 (p->vTtDecs[uVar24 >> 0x18]->pArray[uVar38] == -1)) {
                                while( true ) {
                                  uVar24 = *(uint *)&pC->field_0x1c;
                                  uVar29 = uVar24 >> 0x18;
                                  pIVar45 = (If_Man_t *)p->vTtDecs[uVar29];
                                  if ((int)uVar38 < *(int *)((long)&pIVar45->pName + 4)) break;
                                  Vec_IntPush((Vec_Int_t *)pIVar45,(int)pIVar39);
                                }
                                iVar15 = p->pPars->nLutSize;
                                iVar16 = iVar15 / 2;
                                uVar37 = 0;
                                if ((iVar16 < (int)uVar29) &&
                                   ((int)uVar29 <= (int)(iVar15 - (iVar15 >> 0x1f) & 0xfffffffeU)))
                                {
                                  pVVar8 = p->vTtMem[uVar29];
                                  if (pVVar8 == (Vec_Mem_t *)0x0) {
                                    pwVar21 = (word *)0x0;
                                  }
                                  else {
                                    if (pC->iCutFunc < 0) goto LAB_0042fdc1;
                                    uVar37 = (uint)pC->iCutFunc >> 1;
                                    if (pVVar8->nEntries <= (int)uVar37) goto LAB_0042fe7b;
                                    pwVar21 = pVVar8->ppPages
                                              [uVar37 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                                              (ulong)(uVar37 & pVVar8->PageMask) *
                                              (long)pVVar8->nEntrySize;
                                  }
                                  uVar48 = 1 << ((char)(uVar24 >> 0x18) - 6U & 0x1f);
                                  if (uVar24 < 0x7000000) {
                                    uVar48 = 1;
                                  }
                                  if (0 < (int)uVar48) {
                                    memcpy(local_838,pwVar21,(ulong)uVar48 << 3);
                                  }
                                  pIVar45 = (If_Man_t *)local_838;
                                  uVar37 = Abc_TtProcessBiDecInt((word *)pIVar45,uVar29,iVar16);
                                  if (uVar37 == 0) {
                                    if (0 < (int)uVar48) {
                                      uVar40 = 0;
                                      do {
                                        *(word *)(local_838 + uVar40 * 8) = ~pwVar21[uVar40];
                                        uVar40 = uVar40 + 1;
                                      } while (uVar48 != uVar40);
                                    }
                                    pIVar45 = (If_Man_t *)local_838;
                                    uVar24 = Abc_TtProcessBiDecInt((word *)pIVar45,uVar29,iVar16);
                                    uVar37 = uVar24 | 0x40000000;
                                    if (uVar24 == 0) {
                                      uVar37 = 0;
                                    }
                                  }
                                }
                                if (p->vTtDecs[(byte)pC->field_0x1f]->nSize <= (int)uVar38) {
LAB_0042feb9:
                                  __assert_fail("i >= 0 && i < p->nSize",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                                ,0x1cb,
                                                "void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                                }
                                p->vTtDecs[(byte)pC->field_0x1f]->pArray[uVar38] = uVar37;
                              }
                              uVar24 = *(uint *)&pC->field_0x1c >> 0x18;
                              if (p->vTtDecs[uVar24]->nSize <= (int)uVar38) {
                                __assert_fail("i >= 0 && i < p->nSize",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                              }
                              iVar15 = p->vTtDecs[uVar24]->pArray[uVar38];
                              if (iVar15 < 0) {
                                __assert_fail("iDecMask >= 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                              ,0x182,
                                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                             );
                              }
                              uVar38 = 0;
                              if (iVar15 == 0) {
                                uVar38 = (uint)(p->pPars->nLutSize / 2 < (int)uVar24) << 0xe;
                              }
                              *(uint *)&pC->field_0x1c =
                                   *(uint *)&pC->field_0x1c & 0xffffbfff | uVar38;
                              p->nCutsUselessAll = p->nCutsUselessAll + (uVar38 >> 0xe);
                              p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                                   p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                                   (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                              p->nCutsCountAll = p->nCutsCountAll + 1;
                              p->nCutsCount[(byte)pC->field_0x1f] =
                                   p->nCutsCount[(byte)pC->field_0x1f] + 1;
                            }
                            if ((p->pPars->fUseCofVars != 0) &&
                               ((p->pPars->fUseAndVars == 0 || ((pC->field_0x1d & 0x40) != 0)))) {
                              if (pC->iCutFunc < 0) {
LAB_0042fdc1:
                                __assert_fail("Lit >= 0",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                              ,0x12f,"int Abc_Lit2Var(int)");
                              }
                              uVar24 = (uint)pC->iCutFunc >> 1;
                              if ((p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar24) ||
                                 (p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar24] == -1)) {
                                uVar38 = *(uint *)&pC->field_0x1c;
                                uVar40 = (ulong)(uVar38 >> 0x18);
                                pVVar12 = p->vTtVars[uVar40];
                                uVar29 = pVVar12->nSize;
                                while ((int)uVar29 <= (int)uVar24) {
                                  uVar38 = pVVar12->nCap;
                                  if (uVar29 == uVar38) {
                                    if ((int)uVar38 < 0x10) {
                                      if (pVVar12->pArray == (char *)0x0) {
                                        pcVar19 = (char *)malloc(0x10);
                                      }
                                      else {
                                        pcVar19 = (char *)realloc(pVVar12->pArray,0x10);
                                      }
                                      pVVar12->pArray = pcVar19;
                                      __size = 0x10;
                                    }
                                    else {
                                      __size = (ulong)uVar38 * 2;
                                      if ((int)__size <= (int)uVar38) goto LAB_0042f4a7;
                                      if (pVVar12->pArray == (char *)0x0) {
                                        pcVar19 = (char *)malloc(__size);
                                      }
                                      else {
                                        pcVar19 = (char *)realloc(pVVar12->pArray,__size);
                                      }
                                      pVVar12->pArray = pcVar19;
                                    }
                                    pVVar12->nCap = (int)__size;
                                  }
LAB_0042f4a7:
                                  iVar15 = pVVar12->nSize;
                                  pVVar12->nSize = iVar15 + 1;
                                  pVVar12->pArray[iVar15] = -1;
                                  uVar38 = *(uint *)&pC->field_0x1c;
                                  uVar40 = (ulong)(uVar38 >> 0x18);
                                  pVVar12 = p->vTtVars[uVar40];
                                  uVar29 = pVVar12->nSize;
                                }
                                pIVar45 = (If_Man_t *)(ulong)uVar38;
                                pVVar8 = p->vTtMem[uVar40];
                                if (pVVar8 == (Vec_Mem_t *)0x0) {
                                  puVar50 = (ulong *)0x0;
                                }
                                else {
                                  if (pC->iCutFunc < 0) goto LAB_0042fdc1;
                                  uVar29 = (uint)pC->iCutFunc >> 1;
                                  if (pVVar8->nEntries <= (int)uVar29) goto LAB_0042fe7b;
                                  puVar50 = pVVar8->ppPages
                                            [uVar29 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                                            (ulong)(uVar29 & pVVar8->PageMask) *
                                            (long)pVVar8->nEntrySize;
                                }
                                iVar15 = (int)uVar40;
                                iVar16 = iVar15 + -6;
                                uVar37 = 1 << ((byte)iVar16 & 0x1f);
                                uVar29 = uVar37;
                                if (uVar38 < 0x7000000) {
                                  uVar29 = 1;
                                }
                                if (0xdffffff < uVar38) {
                                  __assert_fail("nVars <= nVarsMax",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                                ,0x5eb,"int Abc_TtCheckCondDep(word *, int, int)");
                                }
                                iVar25 = p->pPars->nLutSize / 2;
                                iVar17 = 0;
                                if ((iVar25 + 1 < iVar15) && (iVar17 = iVar15, 0xffffff < uVar38)) {
                                  uVar48 = uVar37;
                                  if ((int)uVar37 < 2) {
                                    uVar48 = 1;
                                  }
                                  uVar28 = 0;
LAB_0042f5e0:
                                  bVar23 = (byte)uVar28;
                                  if (uVar29 == 1) {
                                    pIVar45 = (If_Man_t *)
                                              ((s_Truths6Neg[uVar28] & *puVar50) <<
                                               ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) |
                                              s_Truths6Neg[uVar28] & *puVar50);
                                    local_838._0_8_ = pIVar45;
                                  }
                                  else if (uVar28 < 6) {
                                    if (0 < (int)uVar29) {
                                      uVar41 = s_Truths6Neg[uVar28];
                                      pIVar45 = (If_Man_t *)0x0;
                                      do {
                                        *(ulong *)(local_838 + (long)pIVar45 * 8) =
                                             (puVar50[(long)pIVar45] & uVar41) <<
                                             ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) |
                                             puVar50[(long)pIVar45] & uVar41;
                                        pIVar45 = (If_Man_t *)((long)&pIVar45->pName + 1);
                                      } while ((If_Man_t *)(ulong)uVar29 != pIVar45);
                                    }
                                  }
                                  else if (0 < (int)uVar29) {
                                    bVar22 = (byte)(uVar28 - 6);
                                    uVar42 = 1 << (bVar22 & 0x1f);
                                    lVar30 = (long)(2 << (bVar22 & 0x1f));
                                    uVar41 = 1;
                                    if (1 < (int)uVar42) {
                                      uVar41 = (ulong)uVar42;
                                    }
                                    pIVar45 = (If_Man_t *)(local_838 + (long)(int)uVar42 * 8);
                                    puVar36 = local_838;
                                    puVar49 = puVar50;
                                    do {
                                      if (uVar28 - 6 != 0x1f) {
                                        uVar51 = 0;
                                        do {
                                          piVar18 = (int *)puVar49[uVar51];
                                          *(int **)(puVar36 + uVar51 * 8) = piVar18;
                                          *(int **)((long)pIVar45->nObjs + (uVar51 - 8) * 8) =
                                               piVar18;
                                          uVar51 = uVar51 + 1;
                                        } while (uVar41 != uVar51);
                                      }
                                      puVar49 = puVar49 + lVar30;
                                      pIVar45 = (If_Man_t *)
                                                ((long)pIVar45->nObjs + (lVar30 + -8) * 8);
                                      puVar36 = puVar36 + lVar30 * 8;
                                    } while (puVar49 < puVar50 + (int)uVar29);
                                  }
                                  if (uVar29 == 1) {
                                    pIVar45 = (If_Man_t *)
                                              ((s_Truths6[uVar28] & *puVar50) >>
                                               ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) |
                                              s_Truths6[uVar28] & *puVar50);
                                    local_438[0] = pIVar45;
                                  }
                                  else if (uVar28 < 6) {
                                    if (0 < (int)uVar29) {
                                      uVar41 = s_Truths6[uVar28];
                                      pIVar45 = (If_Man_t *)0x0;
                                      do {
                                        local_438[(long)pIVar45] =
                                             (If_Man_t *)
                                             ((puVar50[(long)pIVar45] & uVar41) >>
                                              ((byte)(1 << (bVar23 & 0x1f)) & 0x3f) |
                                             puVar50[(long)pIVar45] & uVar41);
                                        pIVar45 = (If_Man_t *)((long)&pIVar45->pName + 1);
                                      } while ((If_Man_t *)(ulong)uVar29 != pIVar45);
                                    }
                                  }
                                  else if (0 < (int)uVar29) {
                                    bVar23 = (byte)(uVar28 - 6);
                                    uVar42 = 1 << (bVar23 & 0x1f);
                                    iVar17 = 2 << (bVar23 & 0x1f);
                                    pIVar45 = (If_Man_t *)0x1;
                                    if (1 < (int)uVar42) {
                                      pIVar45 = (If_Man_t *)(ulong)uVar42;
                                    }
                                    ppIVar35 = local_438;
                                    puVar49 = puVar50;
                                    do {
                                      if (uVar28 - 6 != 0x1f) {
                                        pIVar46 = (If_Man_t *)0x0;
                                        do {
                                          pIVar13 = (If_Man_t *)
                                                    puVar49[(long)pIVar46->nObjs +
                                                            (long)(int)uVar42 + -0x40];
                                          ppIVar35[(long)pIVar46] = pIVar13;
                                          ppIVar35[(long)pIVar46->nObjs + (long)(int)uVar42 + -0x40]
                                               = pIVar13;
                                          pIVar46 = (If_Man_t *)((long)&pIVar46->pName + 1);
                                        } while (pIVar45 != pIVar46);
                                      }
                                      puVar49 = puVar49 + iVar17;
                                      ppIVar35 = ppIVar35 + iVar17;
                                    } while (puVar49 < puVar50 + (int)uVar29);
                                  }
                                  uVar41 = 0;
                                  iVar52 = 0;
                                  iVar17 = 0;
LAB_0042f805:
                                  if (uVar28 != uVar41) {
                                    bVar23 = (byte)uVar41;
                                    if (uVar38 < 0x7000000) {
                                      uVar42 = 1 << (bVar23 & 0x1f);
                                      pIVar45 = (If_Man_t *)(ulong)uVar42;
                                      uVar42 = (uint)((s_Truths6Neg[uVar41] &
                                                      ((ulong)local_838._0_8_ >>
                                                       ((byte)uVar42 & 0x3f) ^ local_838._0_8_)) !=
                                                     0);
                                    }
                                    else {
                                      uVar42 = 0;
                                      if (uVar41 < 6) {
                                        if (iVar16 != 0x1f) {
                                          uVar43 = 1 << (bVar23 & 0x1f);
                                          pIVar45 = (If_Man_t *)(ulong)uVar43;
                                          uVar51 = 0;
                                          do {
                                            if (((*(ulong *)(local_838 + uVar51 * 8) >>
                                                  ((byte)uVar43 & 0x3f) ^
                                                 *(ulong *)(local_838 + uVar51 * 8)) &
                                                s_Truths6Neg[uVar41]) != 0) goto LAB_0042f8e1;
                                            uVar51 = uVar51 + 1;
                                            uVar42 = 0;
                                          } while (uVar48 != uVar51);
                                        }
                                      }
                                      else if (iVar16 != 0x1f) {
                                        pIVar45 = (If_Man_t *)
                                                  (ulong)(uint)(1 << (bVar23 - 6 & 0x1f));
                                        uVar51 = (ulong)(uint)(2 << (bVar23 - 6 & 0x1f));
                                        puVar26 = local_838 + (long)pIVar45 * 8;
                                        puVar36 = local_838;
                                        do {
                                          pIVar46 = (If_Man_t *)0x0;
                                          do {
                                            if (*(long *)(puVar36 + (long)pIVar46 * 8) !=
                                                *(long *)(puVar26 + (long)pIVar46 * 8))
                                            goto LAB_0042f8e1;
                                            pIVar46 = (If_Man_t *)((long)&pIVar46->pName + 1);
                                          } while (pIVar45 != pIVar46);
                                          puVar36 = puVar36 + uVar51 * 8;
                                          puVar26 = puVar26 + uVar51 * 8;
                                          uVar42 = 0;
                                        } while (puVar36 < local_838 + (long)(int)uVar37 * 8);
                                      }
                                    }
                                    goto LAB_0042f8ef;
                                  }
                                  goto LAB_0042f9f3;
                                }
LAB_0042fa2a:
                                if (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar24) {
                                  __assert_fail("i >= 0 && i < p->nSize",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                                ,0x186,
                                                "void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
                                }
                                p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar24] = (char)iVar17;
                              }
                              uVar38 = *(uint *)&pC->field_0x1c;
                              uVar29 = uVar38 >> 0x18;
                              if (p->vTtVars[uVar29]->nSize <= (int)uVar24) {
                                __assert_fail("i >= 0 && i < p->nSize",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                              ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
                              }
                              cVar4 = p->vTtVars[uVar29]->pArray[uVar24];
                              if ((cVar4 < '\0') || ((int)uVar29 < (int)cVar4)) {
                                __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                              ,0x194,
                                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                             );
                              }
                              uVar24 = (uint)(0xffffff < uVar38 && uVar29 == (int)cVar4);
                              *(uint *)&pC->field_0x1c = uVar38 & 0xffffbfff | uVar24 << 0xe;
                              p->nCutsUselessAll = p->nCutsUselessAll + uVar24;
                              p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                                   p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                                   (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                              p->nCutsCountAll = p->nCutsCountAll + 1;
                              p->nCutsCount[(byte)pC->field_0x1f] =
                                   p->nCutsCount[(byte)pC->field_0x1f] + 1;
                            }
                          }
                          else {
                            if (0x4ffffff < uVar24) {
                              __assert_fail("pCut->nLeaves <= 4",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                            ,0x16d,
                                            "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                           );
                            }
                            if ((uVar24 & 0x7000000) == 0x4000000) {
                              uVar24 = pC->iCutFunc;
                              if ((int)uVar24 < 0) goto LAB_0042fe1e;
                              pwVar21 = p->puTempW;
                              pVVar8 = p->vTtMem[4];
                              if (pVVar8 == (Vec_Mem_t *)0x0) {
                                pwVar31 = (word *)0x0;
                              }
                              else {
                                uVar38 = uVar24 >> 1;
                                if (pVVar8->nEntries <= (int)uVar38) goto LAB_0042fe7b;
                                pwVar31 = pVVar8->ppPages
                                          [uVar38 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                                          (ulong)(uVar38 & pVVar8->PageMask) *
                                          (long)pVVar8->nEntrySize;
                              }
                              uVar38 = p->nTruth6Words[4];
                              if ((uVar24 & 1) == 0) {
                                if (0 < (int)uVar38) {
                                  uVar40 = 0;
                                  do {
                                    pwVar21[uVar40] = pwVar31[uVar40];
                                    uVar40 = uVar40 + 1;
                                  } while (uVar38 != uVar40);
                                }
                              }
                              else if (0 < (int)uVar38) {
                                uVar40 = 0;
                                do {
                                  pwVar21[uVar40] = ~pwVar31[uVar40];
                                  uVar40 = uVar40 + 1;
                                } while (uVar38 != uVar40);
                              }
                              uVar24 = (uint)*pwVar21;
                              uVar38 = uVar24 & 0xffff;
                              pIVar45 = (If_Man_t *)(ulong)uVar38;
                              if (((((uVar38 & uVar38 - 1) == 0) || ((uVar24 & 0xffff) == 0x6996))
                                  || ((uVar24 & 0xffff) == 0x9669)) ||
                                 (uVar29 = uVar38 ^ 0xffff, (uVar29 & 0xfffe - uVar38) == 0))
                              goto LAB_0042ecf3;
                              uVar24 = (uVar24 >> 1 & 0x5555) + (uVar24 & 0x5555);
                              uVar24 = (uVar24 >> 2 & 0x3333) + (uVar24 & 0x3333);
                              uVar24 = (uVar24 >> 4 & 0x707) + (uVar24 & 0x707);
                              iVar15 = (uVar24 >> 8) + (uVar24 & 0xff);
                              if (iVar15 == 9) {
                                pIVar45 = (If_Man_t *)(ulong)uVar29;
                                iVar15 = Abc_Tt4CheckTwoLevel(uVar29);
joined_r0x0042f218:
                                if (0 < iVar15) goto LAB_0042ecf3;
                              }
                              else if (iVar15 == 7) {
                                iVar15 = Abc_Tt4CheckTwoLevel(uVar38);
                                goto joined_r0x0042f218;
                              }
                              pC->field_0x1d = pC->field_0x1d | 0x40;
                            }
                          }
                        }
                        else {
                          uVar38 = pC->iCutFunc;
                          if ((int)uVar38 < 0) {
LAB_0042fdff:
                            __assert_fail("pCut->iCutFunc >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                                          ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
                          }
                          uVar24 = p->vTtDsds[uVar24 >> 0x18]->pArray[uVar38 >> 1];
                          if ((int)uVar24 < 0) {
LAB_0042fde0:
                            __assert_fail("Lit >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                          ,0x132,"int Abc_LitNotCond(int, int)");
                          }
                          pIVar45 = (If_Man_t *)p->pIfDsdMan;
                          uVar24 = If_DsdManReadMark((If_DsdMan_t *)pIVar45,uVar24 ^ uVar38 & 1);
                          *(uint *)&pC->field_0x1c =
                               *(uint *)&pC->field_0x1c & 0xffffbfff | (uVar24 & 1) << 0xe;
                          p->nCutsUselessAll = p->nCutsUselessAll + (uVar24 & 1);
                          p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                               p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                               (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                          p->nCutsCountAll = p->nCutsCountAll + 1;
                          p->nCutsCount[(byte)pC->field_0x1f] =
                               p->nCutsCount[(byte)pC->field_0x1f] + 1;
                        }
                      }
                      else {
                        if (*(int *)((long)&pIVar45->puTempW + 4) != 0) {
                          __assert_fail("p->pPars->fUseTtPerm == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                        ,0x13f,
                                        "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                       );
                        }
                        if (0xc < (uVar24 >> 0x10 & 0xff) - 4) {
                          __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                        ,0x140,
                                        "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                       );
                        }
                        if (*(int *)((long)pIVar45->puTemp + 0x14) == 0) {
                          pcVar10 = *(code **)pIVar45->pPerm[1];
                          uVar38 = pC->iCutFunc;
                          if (pcVar10 == (code *)0x0) {
                            if ((int)uVar38 < 0) goto LAB_0042fe1e;
                            pwVar21 = p->puTempW;
                            pVVar8 = p->vTtMem[uVar24 >> 0x18];
                            if (pVVar8 == (Vec_Mem_t *)0x0) {
                              pwVar31 = (word *)0x0;
                            }
                            else {
                              uVar29 = uVar38 >> 1;
                              if (pVVar8->nEntries <= (int)uVar29) goto LAB_0042fe7b;
                              pwVar31 = pVVar8->ppPages[uVar29 >> ((byte)pVVar8->LogPageSze & 0x1f)]
                                        + (ulong)(uVar29 & pVVar8->PageMask) *
                                          (long)pVVar8->nEntrySize;
                            }
                            uVar24 = p->nTruth6Words[uVar24 >> 0x18];
                            if ((uVar38 & 1) == 0) {
                              if (0 < (int)uVar24) {
                                uVar40 = 0;
                                do {
                                  pwVar21[uVar40] = pwVar31[uVar40];
                                  uVar40 = uVar40 + 1;
                                } while (uVar24 != uVar40);
                              }
                            }
                            else if (0 < (int)uVar24) {
                              uVar40 = 0;
                              do {
                                pwVar21[uVar40] = ~pwVar31[uVar40];
                                uVar40 = uVar40 + 1;
                              } while (uVar24 != uVar40);
                            }
                            uVar38 = *(uint *)&pC->field_0x1c >> 0x18;
                            uVar24 = 6;
                            if (6 < uVar38) {
                              uVar24 = uVar38;
                            }
                            paiVar2 = pIVar45->pPerm;
                            pIVar45 = p;
                            iVar15 = (*(code *)pVVar9)(p,pwVar21,uVar24,uVar38,
                                                       *(undefined8 *)*paiVar2);
                          }
                          else {
                            if ((int)uVar38 < 0) goto LAB_0042fe1e;
                            pwVar21 = p->puTempW;
                            pVVar8 = p->vTtMem[uVar24 >> 0x18];
                            if (pVVar8 == (Vec_Mem_t *)0x0) {
                              pwVar31 = (word *)0x0;
                            }
                            else {
                              uVar29 = uVar38 >> 1;
                              if (pVVar8->nEntries <= (int)uVar29) goto LAB_0042fe7b;
                              pwVar31 = pVVar8->ppPages[uVar29 >> ((byte)pVVar8->LogPageSze & 0x1f)]
                                        + (ulong)(uVar29 & pVVar8->PageMask) *
                                          (long)pVVar8->nEntrySize;
                            }
                            uVar24 = p->nTruth6Words[uVar24 >> 0x18];
                            if ((uVar38 & 1) == 0) {
                              if (0 < (int)uVar24) {
                                uVar40 = 0;
                                do {
                                  pwVar21[uVar40] = pwVar31[uVar40];
                                  uVar40 = uVar40 + 1;
                                } while (uVar24 != uVar40);
                              }
                            }
                            else if (0 < (int)uVar24) {
                              uVar40 = 0;
                              do {
                                pwVar21[uVar40] = ~pwVar31[uVar40];
                                uVar40 = uVar40 + 1;
                              } while (uVar24 != uVar40);
                            }
                            pIVar45 = p;
                            iVar15 = (*pcVar10)(p,pwVar21,pC->field_0x1f,0,0);
                          }
                          uVar24 = (uint)(iVar15 == 0);
                        }
                        else {
                          uVar38 = pC->iCutFunc;
                          if ((int)uVar38 < 0) goto LAB_0042fdff;
                          uVar24 = p->vTtDsds[uVar24 >> 0x18]->pArray[uVar38 >> 1];
                          if ((int)uVar24 < 0) goto LAB_0042fde0;
                          pIVar45 = (If_Man_t *)p->pIfDsdMan;
                          uVar24 = If_DsdManCheckDec((If_DsdMan_t *)pIVar45,uVar24 ^ uVar38 & 1);
                          uVar24 = uVar24 & 1;
                        }
                        *(uint *)&pC->field_0x1c =
                             *(uint *)&pC->field_0x1c & 0xffffbfff | uVar24 << 0xe;
                        p->nCutsUselessAll = p->nCutsUselessAll + uVar24;
                        p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                             p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                             (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                        p->nCutsCountAll = p->nCutsCountAll + 1;
                        p->nCutsCount[(byte)pC->field_0x1f] =
                             p->nCutsCount[(byte)pC->field_0x1f] + 1;
                        pIVar6 = p->pPars;
                        if (((pIVar6->fEnableCheck75 == 0) && (pIVar6->fEnableCheck75u == 0)) ||
                           (*(short *)&pC->field_0x1e != 0x505)) {
                          if ((pIVar6->fVerbose != 0) && (pC->field_0x1f == '\x05')) {
                            uVar24 = pC->iCutFunc;
                            if ((int)uVar24 < 0) goto LAB_0042fe1e;
                            pwVar21 = p->puTempW;
                            pVVar8 = p->vTtMem[5];
                            if (pVVar8 == (Vec_Mem_t *)0x0) {
                              pwVar31 = (word *)0x0;
                            }
                            else {
                              uVar38 = uVar24 >> 1;
                              if (pVVar8->nEntries <= (int)uVar38) goto LAB_0042fe7b;
                              pwVar31 = pVVar8->ppPages[uVar38 >> ((byte)pVVar8->LogPageSze & 0x1f)]
                                        + (ulong)(uVar38 & pVVar8->PageMask) *
                                          (long)pVVar8->nEntrySize;
                            }
                            uVar38 = p->nTruth6Words[5];
                            if ((uVar24 & 1) == 0) {
                              if (0 < (int)uVar38) {
                                uVar40 = 0;
                                do {
                                  pwVar21[uVar40] = pwVar31[uVar40];
                                  uVar40 = uVar40 + 1;
                                } while (uVar38 != uVar40);
                              }
                            }
                            else if (0 < (int)uVar38) {
                              uVar40 = 0;
                              do {
                                pwVar21[uVar40] = ~pwVar31[uVar40];
                                uVar40 = uVar40 + 1;
                              } while (uVar38 != uVar40);
                            }
                            pIVar45 = (If_Man_t *)CONCAT44((int)*pwVar21,(int)*pwVar21);
                            p->nCuts5 = p->nCuts5 + 1;
                            pIVar46 = pIVar45;
                            iVar15 = If_CluCheckDecInAny((word)pIVar45,5);
                            if ((iVar15 != 0) ||
                               (iVar15 = If_CluCheckDecOut((word)pIVar45,5), pIVar46 = pIVar45,
                               iVar15 != 0)) {
                              pIVar45 = pIVar46;
                              p->nCuts5a = p->nCuts5a + 1;
                            }
                          }
                        }
                        else {
                          uVar24 = pC->iCutFunc;
                          if ((int)uVar24 < 0) goto LAB_0042fe1e;
                          pwVar21 = p->puTempW;
                          pVVar8 = p->vTtMem[5];
                          if (pVVar8 == (Vec_Mem_t *)0x0) {
                            pwVar31 = (word *)0x0;
                          }
                          else {
                            uVar38 = uVar24 >> 1;
                            if (pVVar8->nEntries <= (int)uVar38) goto LAB_0042fe7b;
                            pwVar31 = pVVar8->ppPages[uVar38 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                                      (ulong)(uVar38 & pVVar8->PageMask) * (long)pVVar8->nEntrySize;
                          }
                          uVar38 = p->nTruth6Words[5];
                          if ((uVar24 & 1) == 0) {
                            if (0 < (int)uVar38) {
                              uVar40 = 0;
                              do {
                                pwVar21[uVar40] = pwVar31[uVar40];
                                uVar40 = uVar40 + 1;
                              } while (uVar38 != uVar40);
                            }
                          }
                          else if (0 < (int)uVar38) {
                            uVar40 = 0;
                            do {
                              pwVar21[uVar40] = ~pwVar31[uVar40];
                              uVar40 = uVar40 + 1;
                            } while (uVar38 != uVar40);
                          }
                          pIVar45 = (If_Man_t *)CONCAT44((int)*pwVar21,(int)*pwVar21);
                          p->nCuts5 = p->nCuts5 + 1;
                          iVar15 = If_CluCheckDecInAny((word)pIVar45,5);
                          if (iVar15 == 0) {
                            iVar16 = 10;
                            goto LAB_0042ecf5;
                          }
                          p->nCuts5a = p->nCuts5a + 1;
                        }
                      }
LAB_0042ecf3:
                      iVar16 = 0;
                    }
                    else {
                      iVar16 = 10;
                    }
                  }
LAB_0042ecf5:
                  if (iVar16 != 0) goto LAB_0042ee7f;
                }
                *(uint *)&pC->field_0x1c =
                     *(uint *)&pC->field_0x1c & 0xffffdfff |
                     (uint)(p->pPars->pFuncCost != (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) <<
                     0xd;
                p_Var11 = p->pPars->pFuncCost;
                if (p_Var11 == (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) {
                  uVar24 = 0;
                }
                else {
                  pIVar45 = p;
                  uVar24 = (*p_Var11)(p,pC);
                  uVar24 = uVar24 & 0xfff;
                }
                uVar38 = *(uint *)&pC->field_0x1c;
                uVar29 = uVar38 & 0xfffff000 | uVar24;
                *(uint *)&pC->field_0x1c = uVar29;
                if (uVar24 != 0xfff) {
                  pIVar6 = p->pPars;
                  if (pIVar6->fDelayOpt == 0) {
                    if (pIVar6->fDsdBalance != 0) {
                      pIVar45 = p;
                      iVar15 = If_CutDsdBalanceEval(p,pC,(Vec_Int_t *)0x0);
                      goto LAB_0042edac;
                    }
                    if (pIVar6->fUserRecLib != 0) {
                      pIVar45 = p;
                      iVar15 = If_CutDelayRecCost3(p,pC,pObj);
                      goto LAB_0042edac;
                    }
                    if (pIVar6->fUserSesLib == 0) {
                      if (pIVar6->fDelayOptLut != 0) {
                        pIVar45 = p;
                        iVar15 = If_CutLutBalanceEval(p,pC);
                        goto LAB_0042edac;
                      }
                      if (pIVar6->nGateSize < 1) {
                        pIVar45 = p;
                        fVar53 = If_CutDelay(p,pObj,pC);
                      }
                      else {
                        pIVar45 = p;
                        iVar15 = If_CutDelaySop(p,pC);
                        fVar53 = (float)iVar15;
                      }
                      pC->Delay = fVar53;
                    }
                    else {
                      local_838._0_8_ = local_838._0_8_ & 0xffffffff00000000;
                      *(uint *)&pC->field_0x1c = uVar29 | 0x2000;
                      uVar24 = pC->iCutFunc;
                      if ((int)uVar24 < 0) {
LAB_0042fe1e:
                        __assert_fail("pCut->iCutFunc >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                                      ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
                      }
                      pIVar45 = (If_Man_t *)p->puTempW;
                      uVar38 = uVar38 >> 0x18;
                      pVVar8 = p->vTtMem[uVar38];
                      if (pVVar8 == (Vec_Mem_t *)0x0) {
                        pwVar21 = (word *)0x0;
                      }
                      else {
                        uVar29 = uVar24 >> 1;
                        if (pVVar8->nEntries <= (int)uVar29) {
LAB_0042fe7b:
                          __assert_fail("i >= 0 && i < p->nEntries",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                                        ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                        }
                        pwVar21 = pVVar8->ppPages[uVar29 >> ((byte)pVVar8->LogPageSze & 0x1f)] +
                                  (ulong)(uVar29 & pVVar8->PageMask) * (long)pVVar8->nEntrySize;
                      }
                      uVar38 = p->nTruth6Words[uVar38];
                      if ((uVar24 & 1) == 0) {
                        if (0 < (int)uVar38) {
                          uVar40 = 0;
                          do {
                            *(int **)((long)pIVar45->nObjs + (uVar40 - 8) * 8) =
                                 (int *)pwVar21[uVar40];
                            uVar40 = uVar40 + 1;
                          } while (uVar38 != uVar40);
                        }
                      }
                      else if (0 < (int)uVar38) {
                        uVar40 = 0;
                        do {
                          *(int **)((long)pIVar45->nObjs + (uVar40 - 8) * 8) =
                               (int *)~pwVar21[uVar40];
                          uVar40 = uVar40 + 1;
                        } while (uVar38 != uVar40);
                      }
                      bVar23 = pC->field_0x1f;
                      piVar18 = If_CutArrTimeProfile(p,pC);
                      bVar22 = pC->field_0x1f;
                      iVar15 = If_ManCutAigDelay(p,pObj,pC);
                      iVar15 = Abc_ExactDelayCost((word *)pIVar45,(uint)bVar23,piVar18,
                                                  (char *)(&pC[1].Area + bVar22),(int *)local_838,
                                                  iVar15);
                      pC->Delay = (float)iVar15;
                      if ((float)local_838._0_4_ == 0.0047237873) {
                        uVar24 = *(uint *)&pC->field_0x1c;
                        if (0xffffff < uVar24) {
                          uVar40 = 0;
                          uVar28 = (ulong)(uVar24 >> 0x18);
                          do {
                            *(undefined1 *)((long)&pC[1].Area + uVar40 + uVar28 * 4) = 0x78;
                            uVar40 = uVar40 + 1;
                            uVar24 = *(uint *)&pC->field_0x1c;
                            uVar28 = (ulong)(uVar24 >> 0x18);
                          } while (uVar40 < uVar28);
                        }
                        *(uint *)&pC->field_0x1c = uVar24 | 0x4fff;
                      }
                    }
                  }
                  else {
                    pIVar45 = p;
                    iVar15 = If_CutSopBalanceEval(p,pC,(Vec_Int_t *)0x0);
LAB_0042edac:
                    pC->Delay = (float)iVar15;
                  }
                  fVar53 = pC->Delay;
                  if (((fVar53 != -1.0) || (NAN(fVar53))) &&
                     ((Mode == 0 || (fVar53 <= pObj->Required + p->fEpsilon)))) {
                    if (Mode == 2) {
                      fVar53 = If_CutAreaDerefed(p,pC);
                    }
                    else {
                      fVar53 = If_CutAreaFlow(p,pC);
                    }
                    pC->Area = fVar53;
                    if (p->pPars->fEdge != 0) {
                      if (Mode == 2) {
                        fVar53 = If_CutEdgeDerefed(p,pC);
                      }
                      else {
                        fVar53 = If_CutEdgeFlow(p,pC);
                      }
                      pC->Edge = fVar53;
                    }
                    if (p->pPars->fPower != 0) {
                      if (Mode == 2) {
                        fVar53 = If_CutPowerDerefed(p,pC,pObj);
                      }
                      else {
                        fVar53 = If_CutPowerFlow(p,pC,pObj);
                      }
                      pC->Power = fVar53;
                    }
                    pIVar45 = p;
                    If_CutSort(p,(If_Set_t *)pCutSet,pC);
                  }
                }
              }
            }
          }
LAB_0042ee7f:
          lVar32 = lVar32 + 1;
          pIVar20 = pObj->pFanin1->pCutSet;
        } while (lVar32 < pIVar20->nCuts);
      }
      iVar15 = (int)pIVar45;
      lVar33 = lVar33 + 1;
      pIVar20 = pObj->pFanin0->pCutSet;
    } while (lVar33 < pIVar20->nCuts);
  }
  if (*(short *)((long)&pCutSet->pName + 2) < 1) {
    __assert_fail("pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0x1cc,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((fPreprocess == 0) ||
     (*(float *)(*(long *)pCutSet->pConst1 + 0xc) <= pObj->Required + p->fEpsilon)) {
    pIVar47 = pCut;
    memcpy(pCut,*(void **)pCutSet->pConst1,(long)p->nCutBytes);
    iVar15 = (int)pIVar47;
    if (((p->pPars->fUserRecLib != 0) || (p->pPars->fUserSesLib != 0)) &&
       (((~*(uint *)&(pObj->CutBest).field_0x1c & 0xfff) == 0 ||
        (pfVar1 = &(pObj->CutBest).Delay, 1e+09 < *pfVar1 || *pfVar1 == 1e+09)))) {
      __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0x1d4,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
  }
  if (((pObj->field_0x1 & 0x10) == 0) && (0x1ffffff < *(uint *)&(pObj->CutBest).field_0x1c)) {
    pIVar7 = pCutSet->pConst1;
    sVar5 = *(short *)((long)&pCutSet->pName + 2);
    *(short *)((long)&pCutSet->pName + 2) = sVar5 + 1;
    pIVar45 = p;
    If_ManSetupCutTriv(p,*(If_Cut_t **)(&pIVar7->field_0x0 + (long)sVar5 * 8),pObj->Id);
    iVar15 = (int)pIVar45;
    if (*(short *)&pCutSet->pName + 1 < (int)*(short *)((long)&pCutSet->pName + 2)) {
      __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                    ,0x1da,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
  }
  if ((Mode != 0) && (0 < pObj->nRefs)) {
    pIVar45 = p;
    If_CutAreaRef(p,pCut);
    iVar15 = (int)pIVar45;
  }
  if (((pObj->CutBest).field_0x1d & 0x40) != 0) {
    Abc_Print(iVar15,"The best cut is useless.\n");
  }
  if ((p->pPars->pFuncUser != (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0) &&
     (pIVar20 = pObj->pCutSet, 0 < pIVar20->nCuts)) {
    lVar33 = 0;
    do {
      if (pIVar20->ppCuts[lVar33] == (If_Cut_t *)0x0) break;
      (*p->pPars->pFuncUser)(p,pObj,pIVar20->ppCuts[lVar33]);
      lVar33 = lVar33 + 1;
      pIVar20 = pObj->pCutSet;
    } while (lVar33 < pIVar20->nCuts);
  }
  If_ManDerefNodeCutSet(p,pObj);
  return;
LAB_0042f8e1:
  uVar42 = 1;
LAB_0042f8ef:
  if (uVar38 < 0x7000000) {
    uVar43 = 1 << (bVar23 & 0x1f);
    pIVar45 = (If_Man_t *)(ulong)uVar43;
    uVar43 = (uint)((s_Truths6Neg[uVar41] &
                    ((ulong)local_438[0] >> ((byte)uVar43 & 0x3f) ^ (ulong)local_438[0])) != 0);
  }
  else {
    uVar43 = 0;
    if (uVar41 < 6) {
      if (iVar16 != 0x1f) {
        uVar44 = 1 << (bVar23 & 0x1f);
        pIVar45 = (If_Man_t *)(ulong)uVar44;
        uVar51 = 0;
        do {
          if ((((ulong)local_438[uVar51] >> ((byte)uVar44 & 0x3f) ^ (ulong)local_438[uVar51]) &
              s_Truths6Neg[uVar41]) != 0) goto LAB_0042f9c0;
          uVar51 = uVar51 + 1;
        } while (uVar48 != uVar51);
      }
    }
    else if (iVar16 != 0x1f) {
      pIVar45 = (If_Man_t *)(ulong)(uint)(1 << (bVar23 - 6 & 0x1f));
      uVar44 = 2 << (bVar23 - 6 & 0x1f);
      ppIVar27 = local_438 + (long)pIVar45;
      ppIVar35 = local_438;
      do {
        pIVar46 = (If_Man_t *)0x0;
        do {
          if (ppIVar35[(long)pIVar46] != ppIVar27[(long)pIVar46]) goto LAB_0042f9c0;
          pIVar46 = (If_Man_t *)((long)&pIVar46->pName + 1);
        } while (pIVar45 != pIVar46);
        ppIVar35 = ppIVar35 + uVar44;
        ppIVar27 = ppIVar27 + uVar44;
      } while (ppIVar35 < local_438 + (int)uVar37);
    }
  }
LAB_0042f9db:
  iVar17 = uVar42 + iVar17;
  uVar51 = uVar41;
  if ((iVar25 < iVar17) || (iVar52 = iVar52 + uVar43, iVar25 < iVar52)) goto LAB_0042fa05;
LAB_0042f9f3:
  uVar41 = uVar41 + 1;
  uVar51 = uVar40;
  if (uVar41 == uVar40) goto LAB_0042fa05;
  goto LAB_0042f805;
LAB_0042f9c0:
  uVar43 = 1;
  goto LAB_0042f9db;
LAB_0042fa05:
  iVar17 = (int)uVar28;
  if (((int)uVar51 == iVar15) || (uVar28 = uVar28 + 1, iVar17 = iVar15, uVar28 == uVar40))
  goto LAB_0042fa2a;
  goto LAB_0042f5e0;
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUserSesLib || 
        p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct || p->pPars->pFuncCell2;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fLut6Filter && pCut->nLeaves == 6 && !If_CutCheckTruth6(p, pCut) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell || p->pPars->pFuncCell2 )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else if ( p->pPars->pFuncCell2 )
                    pCut->fUseless = !p->pPars->pFuncCell2( p, (word *)If_CutTruthW(p, pCut), pCut->nLeaves, NULL, NULL );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if ( p->pPars->fUserRecLib || p->pPars->fUserSesLib )
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}